

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O3

void __thiscall PatternModel::moveCursorRow(PatternModel *this,int amount,SelectMode mode)

{
  if ((this->mPlaying == true) && (this->mFollowing != false)) {
    return;
  }
  if (mode != SelectionModify) {
    if ((mode == SelectionRemove) && (this->mHasSelection == true)) {
      this->mHasSelection = false;
      selectionChanged(this);
    }
    setCursorRow(this,amount + (this->mCursor).super_PatternCursorBase.row);
    return;
  }
  setSelection(this,(PatternCursor)(this->mCursor).super_PatternCursorBase);
  setCursorRow(this,amount + (this->mCursor).super_PatternCursorBase.row);
  setSelection(this,(PatternCursor)(this->mCursor).super_PatternCursorBase);
  return;
}

Assistant:

void PatternModel::moveCursorRow(int amount, SelectMode mode) {
    if (mPlaying && mFollowing) {
        return;
    }
    
    if (mode == SelectionModify) {
        selectCursor();
    } else if (mode == SelectionRemove) {
        deselect();
    }
    setCursorRow(mCursor.row + amount);
    if (mode == SelectionModify) {
        selectCursor();
    }
}